

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

SC_Man * Abc_SclManStart(SC_Lib *pLib,Abc_Ntk_t *pNtk,int fUseWireLoads,int fDept,float DUser,
                        int nTreeCRatio)

{
  size_t __size;
  long *plVar1;
  long lVar2;
  char *__s;
  bool bVar3;
  uint uVar4;
  int iVar5;
  SC_Man *p;
  SC_Pair *pSVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Flt_t *pVVar9;
  float *pfVar10;
  Vec_Que_t *pVVar11;
  int *piVar12;
  Vec_Wec_t *pVVar13;
  Vec_Ptr_t *pVVar14;
  SC_WireLoad *pSVar15;
  char *__dest;
  Vec_Ptr_t *pVVar16;
  long lVar17;
  size_t sVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  ulong local_58;
  
  if (pLib->unit_time != 0xc) {
    __assert_fail("pLib->unit_time == 12",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclSize.h"
                  ,0x98,"SC_Man *Abc_SclManAlloc(SC_Lib *, Abc_Ntk_t *)");
  }
  if (pLib->unit_cap_snd != 0xf) {
    __assert_fail("pLib->unit_cap_snd == 15",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclSize.h"
                  ,0x99,"SC_Man *Abc_SclManAlloc(SC_Lib *, Abc_Ntk_t *)");
  }
  if (pNtk->ntkFunc != ABC_FUNC_MAP) {
    __assert_fail("Abc_NtkHasMapping(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclSize.h"
                  ,0x9a,"SC_Man *Abc_SclManAlloc(SC_Lib *, Abc_Ntk_t *)");
  }
  p = (SC_Man *)calloc(1,0x130);
  p->pLib = pLib;
  p->pNtk = pNtk;
  uVar23 = pNtk->vObjs->nSize;
  p->nObjs = uVar23;
  sVar18 = (size_t)(int)uVar23;
  pSVar6 = (SC_Pair *)calloc(sVar18,8);
  p->pLoads = pSVar6;
  pSVar6 = (SC_Pair *)calloc(sVar18,8);
  p->pDepts = pSVar6;
  pSVar6 = (SC_Pair *)calloc(sVar18,8);
  p->pTimes = pSVar6;
  pSVar6 = (SC_Pair *)calloc(sVar18,8);
  p->pSlews = pSVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar4 = uVar23 - 1;
  uVar19 = uVar23;
  if (uVar4 < 0xf) {
    uVar19 = 0x10;
  }
  pVVar7->nCap = uVar19;
  if (uVar19 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)(int)uVar19 << 2);
  }
  pVVar7->pArray = piVar8;
  pVVar7->nSize = uVar23;
  pfVar10 = (float *)0x0;
  memset(piVar8,0,sVar18 << 2);
  p->vBestFans = pVVar7;
  pVVar14 = pNtk->vCos;
  iVar21 = pVVar14->nSize;
  pVVar9 = (Vec_Flt_t *)malloc(0x10);
  iVar24 = 0x10;
  if (0xe < iVar21 - 1U) {
    iVar24 = iVar21;
  }
  pVVar9->nCap = iVar24;
  if (iVar24 != 0) {
    pfVar10 = (float *)malloc((long)iVar24 << 2);
  }
  pVVar9->pArray = pfVar10;
  pVVar9->nSize = iVar21;
  memset(pfVar10,0,(long)iVar21 << 2);
  p->vTimesOut = pVVar9;
  uVar19 = pVVar14->nSize;
  pVVar11 = (Vec_Que_t *)calloc(1,0x20);
  if ((int)uVar19 < 0x11) {
    uVar19 = 0x10;
  }
  pVVar11->nSize = 1;
  pVVar11->nCap = uVar19 + 1;
  sVar18 = (ulong)uVar19 * 4 + 4;
  piVar8 = (int *)malloc(sVar18);
  memset(piVar8,0xff,sVar18);
  pVVar11->pHeap = piVar8;
  piVar8 = (int *)malloc(sVar18);
  memset(piVar8,0xff,sVar18);
  pVVar11->pOrder = piVar8;
  p->vQue = pVVar11;
  pVVar11->pCostsFlt = &pVVar9->pArray;
  if (0 < pVVar14->nSize) {
    uVar22 = 0;
    do {
      pVVar11 = p->vQue;
      uVar23 = pVVar11->nCap;
      if (pVVar11->nSize < (int)uVar23) {
        lVar25 = (long)(int)uVar23;
      }
      else {
        uVar4 = pVVar11->nSize + 1;
        uVar19 = uVar23 * 2;
        iVar21 = uVar23 * -2;
        uVar23 = uVar19;
        if (uVar4 != uVar19 && SBORROW4(uVar4,uVar19) == (int)(uVar4 + iVar21) < 0) {
          uVar23 = uVar4;
        }
        lVar25 = (long)(int)uVar23;
        sVar18 = lVar25 * 4;
        if (pVVar11->pHeap == (int *)0x0) {
          piVar8 = (int *)malloc(sVar18);
        }
        else {
          piVar8 = (int *)realloc(pVVar11->pHeap,sVar18);
        }
        pVVar11->pHeap = piVar8;
        if (pVVar11->pOrder == (int *)0x0) {
          piVar12 = (int *)malloc(sVar18);
        }
        else {
          piVar12 = (int *)realloc(pVVar11->pOrder,sVar18);
          piVar8 = pVVar11->pHeap;
        }
        pVVar11->pOrder = piVar12;
        memset(piVar8 + pVVar11->nCap,0xff,((long)(int)uVar23 - (long)pVVar11->nCap) * 4);
        memset(pVVar11->pOrder + pVVar11->nCap,0xff,((long)(int)uVar23 - (long)pVVar11->nCap) * 4);
        pVVar11->nCap = uVar23;
      }
      iVar21 = (int)uVar22;
      if (lVar25 <= (long)uVar22) {
        uVar19 = uVar23 * 2;
        uVar4 = iVar21 + 1;
        iVar24 = uVar23 * -2;
        uVar23 = uVar19;
        if (uVar4 != uVar19 && SBORROW4(uVar4,uVar19) == (int)(uVar4 + iVar24) < 0) {
          uVar23 = uVar4;
        }
        sVar18 = (ulong)uVar23 * 4;
        if (pVVar11->pHeap == (int *)0x0) {
          piVar8 = (int *)malloc(sVar18);
        }
        else {
          piVar8 = (int *)realloc(pVVar11->pHeap,sVar18);
        }
        pVVar11->pHeap = piVar8;
        if (pVVar11->pOrder == (int *)0x0) {
          piVar12 = (int *)malloc(sVar18);
        }
        else {
          piVar12 = (int *)realloc(pVVar11->pOrder,sVar18);
          piVar8 = pVVar11->pHeap;
        }
        pVVar11->pOrder = piVar12;
        memset(piVar8 + pVVar11->nCap,0xff,((long)(int)uVar23 - (long)pVVar11->nCap) * 4);
        memset(pVVar11->pOrder + pVVar11->nCap,0xff,((long)(int)uVar23 - (long)pVVar11->nCap) * 4);
        pVVar11->nCap = uVar23;
      }
      iVar24 = pVVar11->nSize;
      if ((int)uVar23 <= iVar24) {
        __assert_fail("p->nSize < p->nCap",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                      ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar8 = pVVar11->pOrder;
      if (piVar8[uVar22] != -1) {
        __assert_fail("p->pOrder[v] == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                      ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar12 = pVVar11->pHeap;
      if (piVar12[iVar24] != -1) {
        __assert_fail("p->pHeap[p->nSize] == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                      ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar8[uVar22] = iVar24;
      iVar24 = pVVar11->nSize;
      pVVar11->nSize = iVar24 + 1;
      piVar12[iVar24] = iVar21;
      pfVar10 = *pVVar11->pCostsFlt;
      if (pfVar10 == (float *)0x0) {
        fVar26 = (float)iVar21;
      }
      else {
        fVar26 = pfVar10[uVar22];
      }
      uVar23 = piVar8[uVar22];
      uVar20 = (ulong)(int)uVar23;
      if (uVar20 == 0xffffffffffffffff) {
        __assert_fail("p->pOrder[v] != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                      ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      if (uVar22 != (uint)piVar12[uVar20]) {
        __assert_fail("p->pHeap[i] == v",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                      ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      if (1 < (int)uVar23) {
        do {
          uVar19 = uVar23 >> 1;
          iVar24 = piVar12[uVar19];
          if (pfVar10 == (float *)0x0) {
            fVar27 = (float)iVar24;
          }
          else {
            fVar27 = pfVar10[iVar24];
          }
          uVar20 = (ulong)uVar23;
          if (fVar26 <= fVar27) break;
          piVar12[uVar23] = iVar24;
          piVar8[iVar24] = uVar23;
          bVar3 = 3 < uVar23;
          uVar20 = (ulong)uVar19;
          uVar23 = uVar19;
        } while (bVar3);
      }
      piVar12[uVar20] = iVar21;
      piVar8[uVar22] = uVar23;
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < (long)pNtk->vCos->nSize);
    uVar23 = p->nObjs;
    uVar4 = uVar23 - 1;
  }
  local_58 = (ulong)uVar23;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar7->pArray = piVar8;
  p->vUpdates = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar7->pArray = piVar8;
  p->vUpdates2 = pVVar7;
  pVVar9 = (Vec_Flt_t *)malloc(0x10);
  pVVar9->nCap = 1000;
  pVVar9->nSize = 0;
  pfVar10 = (float *)malloc(4000);
  pVVar9->pArray = pfVar10;
  p->vLoads2 = pVVar9;
  pVVar9 = (Vec_Flt_t *)malloc(0x10);
  pVVar9->nCap = 1000;
  pVVar9->nSize = 0;
  pfVar10 = (float *)malloc(4000);
  pVVar9->pArray = pfVar10;
  p->vLoads3 = pVVar9;
  pVVar9 = (Vec_Flt_t *)malloc(0x10);
  pVVar9->nCap = 1000;
  pVVar9->nSize = 0;
  pfVar10 = (float *)malloc(4000);
  pVVar9->pArray = pfVar10;
  p->vTimes2 = pVVar9;
  pVVar9 = (Vec_Flt_t *)malloc(0x10);
  pVVar9->nCap = 1000;
  pVVar9->nSize = 0;
  pfVar10 = (float *)malloc(4000);
  pVVar9->pArray = pfVar10;
  p->vTimes3 = pVVar9;
  pVVar9 = (Vec_Flt_t *)malloc(0x10);
  uVar19 = 0x10;
  if (0xe < uVar4) {
    uVar19 = uVar23;
  }
  pVVar9->nCap = uVar19;
  lVar25 = (long)(int)uVar19;
  if (uVar19 == 0) {
    pfVar10 = (float *)0x0;
  }
  else {
    pfVar10 = (float *)malloc(lVar25 * 4);
  }
  pVVar9->pArray = pfVar10;
  pVVar9->nSize = uVar23;
  sVar18 = (long)(int)uVar23 << 2;
  piVar8 = (int *)0x0;
  memset(pfVar10,0,sVar18);
  p->vNode2Gain = pVVar9;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = uVar19;
  if (uVar19 != 0) {
    piVar8 = (int *)malloc(lVar25 * 4);
  }
  pVVar7->pArray = piVar8;
  pVVar7->nSize = uVar23;
  memset(piVar8,0,sVar18);
  p->vNode2Gate = pVVar7;
  pVVar11 = (Vec_Que_t *)calloc(1,0x20);
  uVar22 = 0x10;
  if (0x10 < (int)uVar23) {
    uVar22 = local_58;
  }
  pVVar11->nSize = 1;
  pVVar11->nCap = (int)uVar22 + 1;
  __size = uVar22 * 4 + 4;
  piVar8 = (int *)malloc(__size);
  memset(piVar8,0xff,__size);
  pVVar11->pHeap = piVar8;
  piVar8 = (int *)malloc(__size);
  memset(piVar8,0xff,__size);
  pVVar11->pOrder = piVar8;
  p->vNodeByGain = pVVar11;
  pVVar11->pCostsFlt = &pVVar9->pArray;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = uVar19;
  if (uVar19 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc(lVar25 << 2);
  }
  pVVar7->pArray = piVar8;
  pVVar7->nSize = uVar23;
  memset(piVar8,0xff,sVar18);
  p->vNodeIter = pVVar7;
  iVar5 = Abc_NtkLevel(pNtk);
  iVar21 = iVar5 * 2 + 1;
  pVVar13 = (Vec_Wec_t *)malloc(0x10);
  iVar24 = 8;
  if (6 < (uint)(iVar5 * 2)) {
    iVar24 = iVar21;
  }
  pVVar13->nCap = iVar24;
  pVVar7 = (Vec_Int_t *)calloc((long)iVar24,0x10);
  pVVar13->pArray = pVVar7;
  pVVar13->nSize = iVar21;
  p->vLevels = pVVar13;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar7->pArray = piVar8;
  p->vChanged = pVVar7;
  pVVar14 = pNtk->vCos;
  if (0 < pVVar14->nSize) {
    lVar25 = 0;
    do {
      plVar1 = (long *)pVVar14->pArray[lVar25];
      *(uint *)((long)plVar1 + 0x14) =
           (*(uint *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[4] * 8) + 0x14) & 0xfffff000) +
           (*(uint *)((long)plVar1 + 0x14) & 0xfff) + 0x1000;
      lVar25 = lVar25 + 1;
      pVVar14 = pNtk->vCos;
    } while (lVar25 < pVVar14->nSize);
  }
  pVVar16 = pNtk->vCis;
  if (0 < pVVar16->nSize) {
    lVar25 = 0;
    do {
      *(int *)((long)pVVar16->pArray[lVar25] + 0x38) = (int)lVar25;
      lVar25 = lVar25 + 1;
      pVVar16 = pNtk->vCis;
    } while (lVar25 < pVVar16->nSize);
    pVVar14 = pNtk->vCos;
  }
  if (0 < pVVar14->nSize) {
    lVar25 = 0;
    do {
      *(int *)((long)pVVar14->pArray[lVar25] + 0x38) = (int)lVar25;
      lVar25 = lVar25 + 1;
      pVVar14 = pNtk->vCos;
    } while (lVar25 < pVVar14->nSize);
  }
  if (nTreeCRatio != 0) {
    p->EstLoadMax = (float)nTreeCRatio * 0.01;
    p->EstLinear = 100.0;
  }
  Abc_SclMioGates2SclGates(pLib,pNtk);
  Abc_SclManReadSlewAndLoad(p,pNtk);
  if (fUseWireLoads != 0) {
    if (pNtk->pWLoadUsed == (char *)0x0) {
      pVVar14 = p->pNtk->vObjs;
      lVar25 = (long)pVVar14->nSize;
      if (lVar25 < 1) {
        fVar26 = 0.0;
      }
      else {
        fVar26 = 0.0;
        lVar17 = 0;
        do {
          plVar1 = (long *)pVVar14->pArray[lVar17];
          if ((((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) &&
              (*(int *)((long)plVar1 + 0x1c) != 0)) &&
             (((lVar2 = *plVar1, *(int *)((long)plVar1 + 0x1c) != 1 || (*(int *)(lVar2 + 4) != 4))
              || (plVar1[7] != 0)))) {
            iVar21 = (int)plVar1[2];
            if (((long)iVar21 < 0) || (*(int *)(*(long *)(lVar2 + 0x178) + 4) <= iVar21)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar21 = *(int *)(*(long *)(*(long *)(lVar2 + 0x178) + 8) + (long)iVar21 * 4);
            if (((long)iVar21 < 0) || (*(int *)(*(long *)(lVar2 + 0x170) + 100) <= iVar21)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            fVar26 = fVar26 + *(float *)(*(long *)(*(long *)(*(long *)(lVar2 + 0x170) + 0x68) +
                                                  (long)iVar21 * 8) + 0x18);
          }
          lVar17 = lVar17 + 1;
        } while (lVar25 != lVar17);
      }
      pSVar15 = Abc_SclFindWireLoadModel(pLib,fVar26);
      p->pWLoadUsed = pSVar15;
      if (pSVar15 != (SC_WireLoad *)0x0) {
        __s = pSVar15->pName;
        if (__s == (char *)0x0) {
          __dest = (char *)0x0;
        }
        else {
          sVar18 = strlen(__s);
          __dest = (char *)malloc(sVar18 + 1);
          strcpy(__dest,__s);
        }
        pNtk->pWLoadUsed = __dest;
      }
    }
    else {
      pSVar15 = Abc_SclFetchWireLoadModel(pLib,pNtk->pWLoadUsed);
      p->pWLoadUsed = pSVar15;
    }
  }
  Abc_SclTimeNtkRecompute(p,&p->SumArea0,&p->MaxDelay0,fDept,DUser);
  p->SumArea = p->SumArea0;
  p->MaxDelay = p->MaxDelay0;
  return p;
}

Assistant:

SC_Man * Abc_SclManStart( SC_Lib * pLib, Abc_Ntk_t * pNtk, int fUseWireLoads, int fDept, float DUser, int nTreeCRatio )
{
    SC_Man * p = Abc_SclManAlloc( pLib, pNtk );
    if ( nTreeCRatio )
    {
        p->EstLoadMax = 0.01 * nTreeCRatio;  // max ratio of Cout/Cave when the estimation is used
        p->EstLinear  = 100;                  // linear coefficient
    }
    Abc_SclMioGates2SclGates( pLib, pNtk );
    Abc_SclManReadSlewAndLoad( p, pNtk );
    if ( fUseWireLoads )
    {
        if ( pNtk->pWLoadUsed == NULL )
        {            
            p->pWLoadUsed = Abc_SclFindWireLoadModel( pLib, Abc_SclGetTotalArea(p->pNtk) );
            if ( p->pWLoadUsed )
            pNtk->pWLoadUsed = Abc_UtilStrsav( p->pWLoadUsed->pName );
        }
        else
            p->pWLoadUsed = Abc_SclFetchWireLoadModel( pLib, pNtk->pWLoadUsed );
    }
    Abc_SclTimeNtkRecompute( p, &p->SumArea0, &p->MaxDelay0, fDept, DUser );
    p->SumArea  = p->SumArea0;
    p->MaxDelay = p->MaxDelay0;
    return p;
}